

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TryCatchStatement.h
# Opt level: O2

void __thiscall
TryCatchStatement::TryCatchStatement
          (TryCatchStatement *this,Identifier *ident,ptr<StatementBlock> *tryBlock,
          ptr<StatementBlock> *catchBlock)

{
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR_execute_00133db0;
  std::__cxx11::string::string((string *)&this->ident,(string *)ident);
  std::__shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->tryBlock).super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>,
             &tryBlock->super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->catchBlock).super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>,
             &catchBlock->super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

TryCatchStatement(Identifier ident, ptr<StatementBlock> tryBlock, ptr<StatementBlock> catchBlock)
            : ident(ident), tryBlock(tryBlock), catchBlock(catchBlock) { }